

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDeepImage.cpp
# Opt level: O3

void anon_unknown.dwarf_229b2::verifyImagesAreEqual(DeepImage *img1,DeepImage *img2,int dx,int dy)

{
  LevelMode LVar1;
  LevelMode LVar2;
  LevelRoundingMode LVar3;
  LevelRoundingMode LVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  ArgExc *this;
  uint uVar8;
  char *text;
  uint uVar9;
  
  LVar1 = Imf_2_5::Image::levelMode(&img1->super_Image);
  LVar2 = Imf_2_5::Image::levelMode(&img2->super_Image);
  if (LVar1 == LVar2) {
    LVar3 = Imf_2_5::Image::levelRoundingMode(&img1->super_Image);
    LVar4 = Imf_2_5::Image::levelRoundingMode(&img2->super_Image);
    if (LVar3 == LVar4) {
      iVar5 = Imf_2_5::Image::numXLevels(&img1->super_Image);
      iVar6 = Imf_2_5::Image::numXLevels(&img2->super_Image);
      if (iVar5 == iVar6) {
        iVar5 = Imf_2_5::Image::numYLevels(&img1->super_Image);
        iVar6 = Imf_2_5::Image::numYLevels(&img2->super_Image);
        if (iVar5 == iVar6) {
          LVar1 = Imf_2_5::Image::levelMode(&img1->super_Image);
          if (LVar1 == ONE_LEVEL) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"        level 0",0xf);
            std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
            std::ostream::put(-0x70);
            std::ostream::flush();
            iVar5 = (*(img1->super_Image)._vptr_Image[4])(img1,0);
            iVar6 = (*(img2->super_Image)._vptr_Image[4])(img2,0);
            verifyLevelsAreEqual
                      ((DeepImageLevel *)CONCAT44(extraout_var_03,iVar5),
                       (DeepImageLevel *)CONCAT44(extraout_var_04,iVar6),dx,dy);
            return;
          }
          if (LVar1 == MIPMAP_LEVELS) {
            iVar5 = Imf_2_5::Image::numLevels(&img1->super_Image);
            if (0 < iVar5) {
              uVar9 = 0;
              do {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"        level ",0xe);
                poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar7,"",0);
                std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                std::ostream::put((char)poVar7);
                std::ostream::flush();
                iVar5 = (*(img1->super_Image)._vptr_Image[4])(img1,(ulong)uVar9);
                iVar6 = (*(img2->super_Image)._vptr_Image[4])(img2,(ulong)uVar9);
                verifyLevelsAreEqual
                          ((DeepImageLevel *)CONCAT44(extraout_var_01,iVar5),
                           (DeepImageLevel *)CONCAT44(extraout_var_02,iVar6),dx,dy);
                uVar9 = uVar9 + 1;
                iVar5 = Imf_2_5::Image::numLevels(&img1->super_Image);
              } while ((int)uVar9 < iVar5);
            }
          }
          else {
            if (LVar1 != RIPMAP_LEVELS) {
              __assert_fail("false",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/OpenEXR/IlmImfUtilTest/testDeepImage.cpp"
                            ,0xe0,
                            "void (anonymous namespace)::verifyImagesAreEqual(const DeepImage &, const DeepImage &, int, int)"
                           );
            }
            iVar5 = Imf_2_5::Image::numYLevels(&img1->super_Image);
            if (0 < iVar5) {
              uVar9 = 0;
              do {
                iVar5 = Imf_2_5::Image::numXLevels(&img1->super_Image);
                if (0 < iVar5) {
                  uVar8 = 0;
                  do {
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,"        level (",0xf);
                    poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar8);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
                    poVar7 = (ostream *)std::ostream::operator<<((ostream *)poVar7,uVar9);
                    std::__ostream_insert<char,std::char_traits<char>>(poVar7,")",1);
                    std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
                    std::ostream::put((char)poVar7);
                    std::ostream::flush();
                    iVar5 = (*(img1->super_Image)._vptr_Image[6])(img1,(ulong)uVar8,(ulong)uVar9);
                    iVar6 = (*(img2->super_Image)._vptr_Image[6])(img2,(ulong)uVar8,(ulong)uVar9);
                    verifyLevelsAreEqual
                              ((DeepImageLevel *)CONCAT44(extraout_var,iVar5),
                               (DeepImageLevel *)CONCAT44(extraout_var_00,iVar6),dx,dy);
                    uVar8 = uVar8 + 1;
                    iVar5 = Imf_2_5::Image::numXLevels(&img1->super_Image);
                  } while ((int)uVar8 < iVar5);
                }
                uVar9 = uVar9 + 1;
                iVar5 = Imf_2_5::Image::numYLevels(&img1->super_Image);
              } while ((int)uVar9 < iVar5);
            }
          }
          return;
        }
      }
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      text = "different number of levels";
    }
    else {
      this = (ArgExc *)__cxa_allocate_exception(0x48);
      text = "different level rounding modes";
    }
  }
  else {
    this = (ArgExc *)__cxa_allocate_exception(0x48);
    text = "different level modes";
  }
  Iex_2_5::ArgExc::ArgExc(this,text);
  __cxa_throw(this,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::TypeExc::~TypeExc);
}

Assistant:

void
verifyImagesAreEqual
    (const DeepImage &img1,
     const DeepImage &img2,
     int dx = 0,
     int dy = 0)
{
    if (img1.levelMode() != img2.levelMode())
        throw ArgExc ("different level modes");

    if (img1.levelRoundingMode() != img2.levelRoundingMode())
        throw ArgExc ("different level rounding modes");

    if (img1.numXLevels() != img2.numXLevels() ||
        img1.numYLevels() != img2.numYLevels())
        throw ArgExc ("different number of levels");

    switch (img1.levelMode())
    {
      case ONE_LEVEL:

        cout << "        level 0" << endl;

        verifyLevelsAreEqual
            (img1.level(), img2.level(), dx, dy);

        break;

      case MIPMAP_LEVELS:

        for (int x = 0; x < img1.numLevels(); ++x)
        {
            cout << "        level " << x << "" << endl;

            verifyLevelsAreEqual
                (img1.level (x), img2.level (x), dx, dy);
        }

        break;

      case RIPMAP_LEVELS:

        for (int y = 0; y < img1.numYLevels(); ++y)
        {
            for (int x = 0; x < img1.numXLevels(); ++x)
            {
                cout << "        level (" << x << ", " << y << ")" << endl;

                verifyLevelsAreEqual
                    (img1.level (x, y), img2.level (x, y), dx, dy);
            }
        }

        break;

      default:

        assert (false);
    }
}